

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O2

void __thiscall QDialog::keyPressEvent(QDialog *this,QKeyEvent *e)

{
  QPushButton *this_00;
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int i;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QPushButton_*> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QKeyEvent::matches((StandardKey)e);
  if (cVar1 != '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      (**(code **)(*(long *)&this->super_QWidget + 0x1c0))(this);
      return;
    }
    goto LAB_00492cd5;
  }
  iVar3 = QKeyEvent::modifiers();
  if (iVar3 == 0) {
    if ((*(uint *)(e + 0x40) & 0xfffffffe) == 0x1000004) goto LAB_00492c53;
LAB_00492c3e:
    e[0xc] = (QKeyEvent)0x0;
  }
  else {
    uVar4 = QKeyEvent::modifiers();
    if (((uVar4 >> 0x1d & 1) == 0) || (*(int *)(e + 0x40) != 0x1000005)) goto LAB_00492c3e;
LAB_00492c53:
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QPushButton **)&DAT_aaaaaaaaaaaaaaaa;
    QObject::findChildren<QPushButton*>
              ((QList<QPushButton_*> *)&local_38,(QObject *)this,(FindChildOptions)0x1);
    for (puVar5 = (undefined1 *)0x0; puVar5 < (ulong)local_38.size; puVar5 = puVar5 + 1) {
      this_00 = local_38.ptr[(long)puVar5];
      bVar2 = QPushButton::isDefault(this_00);
      if ((bVar2) &&
         (uVar4 = ((this_00->super_QAbstractButton).super_QWidget.data)->widget_attributes,
         (short)uVar4 < 0)) {
        if ((uVar4 & 1) == 0) {
          QAbstractButton::click(&this_00->super_QAbstractButton);
        }
        break;
      }
    }
    QArrayDataPointer<QPushButton_*>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00492cd5:
  __stack_chk_fail();
}

Assistant:

void QDialog::keyPressEvent(QKeyEvent *e)
{
#ifndef QT_NO_SHORTCUT
    //   Calls reject() if Escape is pressed. Simulates a button
    //   click for the default button if Enter is pressed. Move focus
    //   for the arrow keys. Ignore the rest.
    if (e->matches(QKeySequence::Cancel)) {
        reject();
    } else
#endif
    if (!e->modifiers() || (e->modifiers() & Qt::KeypadModifier && e->key() == Qt::Key_Enter)) {
        switch (e->key()) {
#if QT_CONFIG(pushbutton)
        case Qt::Key_Enter:
        case Qt::Key_Return: {
            QList<QPushButton*> list = findChildren<QPushButton*>();
            for (int i=0; i<list.size(); ++i) {
                QPushButton *pb = list.at(i);
                if (pb->isDefault() && pb->isVisible()) {
                    if (pb->isEnabled())
                        pb->click();
                    return;
                }
            }
        }
        break;
#endif
        default:
            e->ignore();
            return;
        }
    } else {
        e->ignore();
    }
}